

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backlog.cpp
# Opt level: O2

string * __thiscall
Backlog::getter_dataLimita_abi_cxx11_(string *__return_storage_ptr__,Backlog *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->data_limita);
  return __return_storage_ptr__;
}

Assistant:

std::string Backlog::getter_dataLimita() {
    return data_limita;
}